

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

void flatbuffers::AppendOption
               (stringstream *ss,FlatCOption *option,size_t max_col,size_t min_col_for_description)

{
  string *psVar1;
  size_t __n;
  ulong uVar2;
  long lVar3;
  ostream *poVar4;
  undefined1 local_90 [8];
  string description;
  allocator<char> local_59;
  string local_58 [32];
  ulong local_38;
  size_t start_of_description;
  size_t chars;
  size_t min_col_for_description_local;
  size_t max_col_local;
  FlatCOption *option_local;
  stringstream *ss_local;
  
  start_of_description = 2;
  chars = min_col_for_description;
  min_col_for_description_local = max_col;
  max_col_local = (size_t)option;
  option_local = (FlatCOption *)ss;
  std::operator<<((ostream *)(ss + 0x10),"  ");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    lVar3 = std::__cxx11::string::length();
    start_of_description = lVar3 + 2 + start_of_description;
    poVar4 = std::operator<<((ostream *)(option_local->short_opt).field_2._M_local_buf,"-");
    std::operator<<(poVar4,(string *)max_col_local);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      start_of_description = start_of_description + 1;
      std::operator<<((ostream *)(option_local->short_opt).field_2._M_local_buf,",");
    }
    std::operator<<((ostream *)(option_local->short_opt).field_2._M_local_buf," ");
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    lVar3 = std::__cxx11::string::length();
    start_of_description = lVar3 + 3 + start_of_description;
    poVar4 = std::operator<<((ostream *)(option_local->short_opt).field_2._M_local_buf,"--");
    poVar4 = std::operator<<(poVar4,(string *)(max_col_local + 0x20));
    std::operator<<(poVar4," ");
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    lVar3 = std::__cxx11::string::length();
    start_of_description = lVar3 + 1 + start_of_description;
    poVar4 = std::operator<<((ostream *)(option_local->short_opt).field_2._M_local_buf,
                             (string *)(max_col_local + 0x40));
    std::operator<<(poVar4," ");
  }
  local_38 = start_of_description;
  if (chars < start_of_description) {
    std::operator<<((ostream *)(option_local->short_opt).field_2._M_local_buf,"\n");
    __n = chars;
    local_38 = chars;
    psVar1 = &option_local->short_opt;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,__n,' ',&local_59);
    std::operator<<((ostream *)(psVar1->field_2)._M_local_buf,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    for (; local_38 < chars; local_38 = local_38 + 1) {
      std::operator<<((ostream *)(option_local->short_opt).field_2._M_local_buf," ");
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_90,(string *)(max_col_local + 0x60));
    AppendTextWrappedString
              ((stringstream *)option_local,(string *)local_90,min_col_for_description_local,
               local_38);
    std::__cxx11::string::~string((string *)local_90);
  }
  std::operator<<((ostream *)(option_local->short_opt).field_2._M_local_buf,"\n");
  return;
}

Assistant:

static void AppendOption(std::stringstream &ss, const FlatCOption &option,
                         size_t max_col, size_t min_col_for_description) {
  size_t chars = 2;
  ss << "  ";
  if (!option.short_opt.empty()) {
    chars += 2 + option.short_opt.length();
    ss << "-" << option.short_opt;
    if (!option.long_opt.empty()) {
      chars++;
      ss << ",";
    }
    ss << " ";
  }
  if (!option.long_opt.empty()) {
    chars += 3 + option.long_opt.length();
    ss << "--" << option.long_opt << " ";
  }
  if (!option.parameter.empty()) {
    chars += 1 + option.parameter.length();
    ss << option.parameter << " ";
  }
  size_t start_of_description = chars;
  if (start_of_description > min_col_for_description) {
    ss << "\n";
    start_of_description = min_col_for_description;
    ss << std::string(start_of_description, ' ');
  } else {
    while (start_of_description < min_col_for_description) {
      ss << " ";
      start_of_description++;
    }
  }
  if (!option.description.empty()) {
    std::string description = option.description;
    AppendTextWrappedString(ss, description, max_col, start_of_description);
  }
  ss << "\n";
}